

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderObjdump *this,Index segment_index,Index func_index)

{
  string_view sVar1;
  
  PrintDetails(this,"  - elem[%u] = func[%u]",(ulong)(this->elem_index_ + this->elem_offset_),
               (ulong)func_index);
  sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names,
                            func_index);
  if (sVar1.size_ != 0) {
    PrintDetails(this," <%.*s>",sVar1.size_,sVar1.data_);
  }
  PrintDetails(this,"\n");
  this->elem_index_ = this->elem_index_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                          Index func_index) {
  PrintDetails("  - elem[%" PRIindex "] = func[%" PRIindex "]",
               elem_offset_ + elem_index_, func_index);
  auto name = GetFunctionName(func_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  elem_index_++;
  return Result::Ok;
}